

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

size_t EC_get_builtin_curves(EC_builtin_curve *r,size_t nitems)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 4;
  if (nitems < 4) {
    iVar2 = (int)nitems;
  }
  for (uVar3 = 0; (uint)(iVar2 << 3) != uVar3; uVar3 = uVar3 + 8) {
    lVar1 = (**(code **)((long)kAllGroups + uVar3))();
    *(undefined4 *)((long)&r->nid + uVar3 * 2) = *(undefined4 *)(lVar1 + 0x200);
    *(undefined8 *)((long)&r->comment + uVar3 * 2) = *(undefined8 *)(lVar1 + 0x1f8);
  }
  return 4;
}

Assistant:

size_t EC_get_builtin_curves(EC_builtin_curve *out_curves,
                             size_t max_num_curves) {
  if (max_num_curves > OPENSSL_ARRAY_SIZE(kAllGroups)) {
    max_num_curves = OPENSSL_ARRAY_SIZE(kAllGroups);
  }
  for (size_t i = 0; i < max_num_curves; i++) {
    const EC_GROUP *group = kAllGroups[i]();
    out_curves[i].nid = group->curve_name;
    out_curves[i].comment = group->comment;
  }
  return OPENSSL_ARRAY_SIZE(kAllGroups);
}